

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffio.c
# Opt level: O0

void tidyBufCheckAlloc(TidyBuffer *buf,uint allocSize,uint chunkSize)

{
  byte *pbVar1;
  uint local_24;
  uint allocAmt;
  byte *bp;
  uint chunkSize_local;
  uint allocSize_local;
  TidyBuffer *buf_local;
  
  if (buf == (TidyBuffer *)0x0) {
    __assert_fail("buf != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/buffio.c"
                  ,0x75,"void tidyBufCheckAlloc(TidyBuffer *, uint, uint)");
  }
  if (buf->allocator == (TidyAllocator *)0x0) {
    setDefaultAllocator(buf);
  }
  bp._0_4_ = chunkSize;
  if (chunkSize == 0) {
    bp._0_4_ = 0x100;
  }
  if (buf->allocated < allocSize + 1) {
    local_24 = (uint)bp;
    if (buf->allocated != 0) {
      local_24 = buf->allocated;
    }
    for (; local_24 < allocSize + 1; local_24 = local_24 << 1) {
    }
    pbVar1 = (byte *)(*buf->allocator->vtbl->realloc)(buf->allocator,buf->bp,(size_t)local_24);
    if (pbVar1 != (byte *)0x0) {
      memset(pbVar1 + buf->allocated,0,(ulong)(local_24 - buf->allocated));
      buf->bp = pbVar1;
      buf->allocated = local_24;
    }
  }
  return;
}

Assistant:

void TIDY_CALL tidyBufCheckAlloc( TidyBuffer* buf, uint allocSize, uint chunkSize )
{
    assert( buf != NULL );

    if ( !buf->allocator )
        setDefaultAllocator( buf );
        
    if ( 0 == chunkSize )
        chunkSize = 256;
    if ( allocSize+1 > buf->allocated )
    {
        byte* bp;
        uint allocAmt = chunkSize;
        if ( buf->allocated > 0 )
            allocAmt = buf->allocated;
        while ( allocAmt < allocSize+1 )
            allocAmt *= 2;

        bp = (byte*)TidyRealloc( buf->allocator, buf->bp, allocAmt );
        if ( bp != NULL )
        {
            TidyClearMemory( bp + buf->allocated, allocAmt - buf->allocated );
            buf->bp = bp;
            buf->allocated = allocAmt;
        }
    }
}